

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O1

int mbedtls_mpi_mod_mpi(mbedtls_mpi *R,mbedtls_mpi *A,mbedtls_mpi *B)

{
  int iVar1;
  mbedtls_mpi_uint p [1];
  mbedtls_mpi Y;
  mbedtls_mpi_uint local_40;
  mbedtls_mpi local_38;
  
  local_40 = 0;
  local_38.s = 1;
  local_38.n = 1;
  local_38.p = &local_40;
  iVar1 = mbedtls_mpi_cmp_mpi(B,&local_38);
  if (iVar1 < 0) {
    return -10;
  }
  iVar1 = mbedtls_mpi_div_mpi((mbedtls_mpi *)0x0,R,A,B);
  if (iVar1 != 0) {
    return iVar1;
  }
  do {
    local_40 = 0;
    local_38.s = 1;
    local_38.n = 1;
    local_38.p = &local_40;
    iVar1 = mbedtls_mpi_cmp_mpi(R,&local_38);
    if (-1 < iVar1) {
      do {
        iVar1 = mbedtls_mpi_cmp_mpi(R,B);
        if (iVar1 < 0) {
          return 0;
        }
        iVar1 = mbedtls_mpi_sub_mpi(R,R,B);
      } while (iVar1 == 0);
      return iVar1;
    }
    iVar1 = mbedtls_mpi_add_mpi(R,R,B);
  } while (iVar1 == 0);
  return iVar1;
}

Assistant:

int mbedtls_mpi_mod_mpi( mbedtls_mpi *R, const mbedtls_mpi *A, const mbedtls_mpi *B )
{
    int ret;

    if( mbedtls_mpi_cmp_int( B, 0 ) < 0 )
        return( MBEDTLS_ERR_MPI_NEGATIVE_VALUE );

    MBEDTLS_MPI_CHK( mbedtls_mpi_div_mpi( NULL, R, A, B ) );

    while( mbedtls_mpi_cmp_int( R, 0 ) < 0 )
      MBEDTLS_MPI_CHK( mbedtls_mpi_add_mpi( R, R, B ) );

    while( mbedtls_mpi_cmp_mpi( R, B ) >= 0 )
      MBEDTLS_MPI_CHK( mbedtls_mpi_sub_mpi( R, R, B ) );

cleanup:

    return( ret );
}